

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

s32 __thiscall
irr::video::CNullDriver::addHighLevelShaderMaterialFromFiles
          (CNullDriver *this,path *vertexShaderProgramFileName,c8 *vertexShaderEntryPointName,
          E_VERTEX_SHADER_TYPE vsCompileTarget,path *pixelShaderProgramFileName,
          c8 *pixelShaderEntryPointName,E_PIXEL_SHADER_TYPE psCompileTarget,
          path *geometryShaderProgramFileName,c8 *geometryShaderEntryPointName,
          E_GEOMETRY_SHADER_TYPE gsCompileTarget,E_PRIMITIVE_TYPE inType,E_PRIMITIVE_TYPE outType,
          u32 verticesOut,IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,
          s32 userData)

{
  u32 uVar1;
  s32 sVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  double __x;
  double __x_00;
  double __x_01;
  undefined4 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  undefined4 in_stack_00000030;
  undefined4 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined4 in_stack_00000048;
  undefined4 in_stack_00000050;
  s32 result;
  IReadFile *gsfile;
  IReadFile *psfile;
  IReadFile *vsfile;
  undefined4 in_stack_ffffffffffffff1c;
  long local_78;
  long local_70;
  long local_68;
  
  local_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uVar1 = core::string<char>::size((string<char> *)0x30d571);
  if ((uVar1 != 0) &&
     (local_68 = (*(code *)**(undefined8 **)in_RDI[0x24])((undefined8 *)in_RDI[0x24],in_RSI),
     local_68 == 0)) {
    os::Printer::log(__x);
  }
  uVar1 = core::string<char>::size((string<char> *)0x30d5ca);
  if ((uVar1 != 0) &&
     (local_70 = (*(code *)**(undefined8 **)in_RDI[0x24])((undefined8 *)in_RDI[0x24],in_R8),
     local_70 == 0)) {
    os::Printer::log(__x_00);
  }
  uVar1 = core::string<char>::size((string<char> *)0x30d61d);
  if ((uVar1 != 0) &&
     (local_78 = (*(code *)**(undefined8 **)in_RDI[0x24])
                           ((undefined8 *)in_RDI[0x24],in_stack_00000010), local_78 == 0)) {
    os::Printer::log(__x_01);
  }
  sVar2 = (**(code **)(*in_RDI + 0x398))
                    (in_RDI,local_68,in_RDX,in_ECX,local_70,in_R9,in_stack_00000008,local_78,
                     in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
                     in_stack_00000038,in_stack_00000040,in_stack_00000048,in_stack_00000050);
  if (local_70 != 0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_00000008));
  }
  if (local_68 != 0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_00000008));
  }
  if (local_78 != 0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_00000008));
  }
  return sVar2;
}

Assistant:

s32 CNullDriver::addHighLevelShaderMaterialFromFiles(
		const io::path &vertexShaderProgramFileName,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		const io::path &pixelShaderProgramFileName,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		const io::path &geometryShaderProgramFileName,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	io::IReadFile *vsfile = 0;
	io::IReadFile *psfile = 0;
	io::IReadFile *gsfile = 0;

	if (vertexShaderProgramFileName.size()) {
		vsfile = FileSystem->createAndOpenFile(vertexShaderProgramFileName);
		if (!vsfile) {
			os::Printer::log("Could not open vertex shader program file",
					vertexShaderProgramFileName, ELL_WARNING);
		}
	}

	if (pixelShaderProgramFileName.size()) {
		psfile = FileSystem->createAndOpenFile(pixelShaderProgramFileName);
		if (!psfile) {
			os::Printer::log("Could not open pixel shader program file",
					pixelShaderProgramFileName, ELL_WARNING);
		}
	}

	if (geometryShaderProgramFileName.size()) {
		gsfile = FileSystem->createAndOpenFile(geometryShaderProgramFileName);
		if (!gsfile) {
			os::Printer::log("Could not open geometry shader program file",
					geometryShaderProgramFileName, ELL_WARNING);
		}
	}

	s32 result = addHighLevelShaderMaterialFromFiles(
			vsfile, vertexShaderEntryPointName, vsCompileTarget,
			psfile, pixelShaderEntryPointName, psCompileTarget,
			gsfile, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	if (psfile)
		psfile->drop();

	if (vsfile)
		vsfile->drop();

	if (gsfile)
		gsfile->drop();

	return result;
}